

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void cfd::core::ConvertFromUniValue<long>(long *value,UniValue *json_value)

{
  bool bVar1;
  reference pcVar2;
  int64_t iVar3;
  undefined8 uVar4;
  UniValue *in_RSI;
  long *in_RDI;
  int64_t minimum;
  int64_t maximum;
  int64_t num;
  bool is_digits_only;
  const_iterator begin_pos;
  string *str;
  UniValue json_value_copy;
  UniValue *in_stack_fffffffffffffda8;
  UniValue *in_stack_fffffffffffffdb0;
  allocator *paVar5;
  string *in_stack_fffffffffffffdc0;
  string *message;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdc8;
  CfdError CVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd0;
  VType in_stack_fffffffffffffddc;
  VType initialType;
  UniValue *in_stack_fffffffffffffde0;
  UniValue *this;
  allocator local_209;
  string local_208 [32];
  CfdSourceLocation local_1e8;
  undefined1 local_1ca;
  undefined1 local_1c9 [33];
  char *local_1a8;
  undefined4 local_1a0;
  char *local_198;
  long local_190;
  long local_188;
  int64_t local_180;
  UniValue local_178;
  undefined8 local_120;
  char *local_118;
  undefined1 local_109;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined1 local_f9 [33];
  UniValue local_d8;
  string *local_70;
  UniValue local_68;
  UniValue *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffdd0._M_current,
                     (UniValue *)in_stack_fffffffffffffdc8._M_current);
  bVar1 = UniValue::isStr(&local_68);
  if (bVar1) {
    local_70 = UniValue::get_str_abi_cxx11_(local_10);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    if (bVar1) {
      this = (UniValue *)local_f9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)(local_f9 + 1),"0",(allocator *)this);
      UniValue::UniValue(this,in_stack_fffffffffffffddc,
                         (string *)in_stack_fffffffffffffdd0._M_current);
      UniValue::operator=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      UniValue::~UniValue(&local_d8);
      ::std::__cxx11::string::~string((string *)(local_f9 + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)local_f9);
    }
    else {
      local_108._M_current = (char *)::std::__cxx11::string::begin();
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_108);
      if (*pcVar2 == '-') {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_108);
      }
      local_118 = local_108._M_current;
      local_120 = ::std::__cxx11::string::end();
      local_109 = ::std::
                  all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)>
                            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                             (_func_int_int *)in_stack_fffffffffffffdc0);
      initialType = CONCAT13(local_109,(int3)in_stack_fffffffffffffddc);
      if ((bool)local_109) {
        in_stack_fffffffffffffdd0._M_current = (char *)UniValue::get_str_abi_cxx11_(local_10);
        UniValue::UniValue(in_stack_fffffffffffffde0,initialType,
                           (string *)in_stack_fffffffffffffdd0._M_current);
        UniValue::operator=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        UniValue::~UniValue(&local_178);
      }
    }
  }
  CVar6 = (CfdError)((ulong)in_stack_fffffffffffffdc8._M_current >> 0x20);
  bVar1 = UniValue::isNum(&local_68);
  if (bVar1) {
    iVar3 = UniValue::get_int64(&local_68);
    local_180 = iVar3;
    local_188 = ::std::numeric_limits<long>::max();
    CVar6 = (CfdError)((ulong)iVar3 >> 0x20);
    local_190 = ::std::numeric_limits<long>::min();
    if ((local_180 <= local_188) && (local_190 <= local_180)) {
      *local_8 = local_180;
      UniValue::~UniValue(&local_68);
      return;
    }
    local_1a8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
                        ,0x2f);
    local_1a8 = local_1a8 + 1;
    local_1a0 = 0xf8;
    local_198 = "ConvertFromUniValue";
    logger::warn<long_const&>
              ((CfdSourceLocation *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
               (long *)0x70f62e);
    local_1ca = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    message = (string *)local_1c9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_1c9 + 1),"Json value convert error. Value out of range.",
               (allocator *)message);
    CfdException::CfdException((CfdException *)in_stack_fffffffffffffdd0._M_current,CVar6,message);
    local_1ca = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1e8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
               ,0x2f);
  local_1e8.filename = local_1e8.filename + 1;
  local_1e8.line = 0x100;
  local_1e8.funcname = "ConvertFromUniValue";
  logger::warn<>(&local_1e8,"Invalid json format.");
  uVar4 = __cxa_allocate_exception(0x30);
  paVar5 = &local_209;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_208,"Json value convert error. Invalid json format.",paVar5);
  CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffffdd0._M_current,CVar6,in_stack_fffffffffffffdc0);
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    const auto& str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}